

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

string * __thiscall
testing::internal::
FormatForComparisonFailureMessage<ClParser_Enum_Test::TestBody()::color,ClParser_Enum_Test::TestBody()::color>
          (string *__return_storage_ptr__,internal *this,color *value,color *param_2)

{
  color *param_1_local;
  color *value_local;
  
  FormatForComparison<ClParser_Enum_Test::TestBody()::color,ClParser_Enum_Test::TestBody()::color>::
  Format_abi_cxx11_(__return_storage_ptr__,
                    (FormatForComparison<ClParser_Enum_Test::TestBody()::color,ClParser_Enum_Test::TestBody()::color>
                     *)this,value);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatForComparisonFailureMessage(
    const T1& value, const T2& /* other_operand */) {
  return FormatForComparison<T1, T2>::Format(value);
}